

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::CLUFactor<double>::initFactorMatrix
          (CLUFactor<double> *this,SVectorBase<double> **vec,double eps)

{
  CLUFactor<double> *a;
  long lVar1;
  SVectorBase<double> *pSVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  double *pdVar7;
  reference pvVar8;
  uint uVar9;
  int __c;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c_00;
  ulong extraout_RDX;
  long in_RSI;
  undefined4 *in_RDI;
  Real RVar11;
  Real RVar12;
  int j_3;
  int k_1;
  int end;
  int j_2;
  int j_1;
  int nnonzeros;
  int i_3;
  int i_2;
  int j;
  int k;
  int i_1;
  int i;
  int *sing;
  SVectorBase<double> *psv;
  Dring *lastcring;
  Dring *cring;
  Dring *lastrring;
  Dring *rring;
  int tot;
  int m;
  double x;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  CLUFactor<double> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  int p_row;
  long lVar13;
  uint in_stack_ffffffffffffff64;
  uint local_88;
  uint local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  uint local_68;
  int local_60;
  int local_5c;
  long *local_48;
  long *local_40;
  long *local_38;
  long *local_30;
  int local_24;
  ulong uVar10;
  
  lVar1 = *(long *)(in_RDI + 0x78);
  for (local_5c = 0; local_5c < (int)in_RDI[1]; local_5c = local_5c + 1) {
    *(undefined4 *)(*(long *)(in_RDI + 0x52) + (long)local_5c * 4) = 0;
    *(undefined4 *)(*(long *)(in_RDI + 0x54) + (long)local_5c * 4) = 0;
  }
  for (local_60 = 0; local_60 < (int)in_RDI[1]; local_60 = local_60 + 1) {
    pSVar2 = *(SVectorBase<double> **)(in_RSI + (long)local_60 * 8);
    iVar4 = SVectorBase<double>::size(pSVar2);
    if (iVar4 < 2) {
      if (iVar4 == 0) {
        *in_RDI = 2;
        return;
      }
    }
    else {
      uVar10 = extraout_RDX;
      for (local_68 = 0; (int)local_68 < iVar4; local_68 = local_68 + 1) {
        lVar13 = *(long *)(in_RDI + 0x54);
        pcVar6 = SVectorBase<double>::index(pSVar2,(char *)(ulong)local_68,(int)uVar10);
        uVar9 = *(int *)(lVar13 + (long)(int)pcVar6 * 4) + 1;
        uVar10 = (ulong)uVar9;
        *(uint *)(lVar13 + (long)(int)pcVar6 * 4) = uVar9;
      }
    }
  }
  minRowMem(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  minColMem(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  minLMem(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  **(undefined4 **)(in_RDI + 0x50) = 0;
  local_30 = *(long **)(in_RDI + 0x44);
  local_38 = (long *)(in_RDI + 0x3e);
  in_RDI[0x42] = in_RDI[1];
  *local_38 = (long)local_30;
  local_40 = *(long **)(in_RDI + 0x5c);
  local_48 = (long *)(in_RDI + 0x56);
  in_RDI[0x5a] = in_RDI[1];
  *local_48 = (long)local_40;
  local_24 = 0;
  for (local_6c = 0; local_6c < (int)in_RDI[1]; local_6c = local_6c + 1) {
    *(int *)(*(long *)(in_RDI + 0x50) + (long)local_6c * 4) = local_24;
    local_24 = *(int *)(*(long *)(in_RDI + 0x54) + (long)local_6c * 4) + local_24;
    *(int *)(local_30 + 2) = local_6c;
    local_30[1] = (long)local_38;
    *local_38 = (long)local_30;
    local_38 = local_30;
    local_30 = local_30 + 3;
    *(int *)(local_40 + 2) = local_6c;
    local_40[1] = (long)local_48;
    *local_48 = (long)local_40;
    local_48 = local_40;
    local_40 = local_40 + 3;
  }
  *(undefined4 *)(*(long *)(in_RDI + 0x50) + (long)(int)in_RDI[1] * 4) = 0;
  *(undefined4 *)(*(long *)(in_RDI + 0x54) + (long)(int)in_RDI[1] * 4) = 0;
  in_RDI[0x47] = local_24;
  *local_38 = (long)(in_RDI + 0x3e);
  *(long **)(*local_38 + 8) = local_38;
  *local_48 = (long)(in_RDI + 0x56);
  *(long **)(*local_48 + 8) = local_48;
  local_24 = 0;
  in_RDI[0x82] = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  local_70 = 0;
  while( true ) {
    if ((int)in_RDI[1] <= local_70) {
      in_RDI[0x5f] = local_24;
      return;
    }
    pSVar2 = *(SVectorBase<double> **)(in_RSI + (long)local_70 * 8);
    *(int *)(*(long *)(in_RDI + 0x68) + (long)local_70 * 4) = local_24;
    local_74 = 0;
    local_78 = 0;
    while( true ) {
      iVar4 = local_78;
      iVar5 = SVectorBase<double>::size(pSVar2);
      uVar9 = in_stack_ffffffffffffff64 & 0xffffff;
      if (iVar4 < iVar5) {
        uVar9 = CONCAT13(local_74 < 2,(int3)in_stack_ffffffffffffff64);
      }
      in_stack_ffffffffffffff64 = uVar9;
      if ((char)(in_stack_ffffffffffffff64 >> 0x18) == '\0') break;
      SVectorBase<double>::value(pSVar2,local_78);
      bVar3 = isNotZero<double,double>
                        ((double)in_stack_ffffffffffffff40,
                         (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (bVar3) {
        local_74 = local_74 + 1;
      }
      local_78 = local_78 + 1;
    }
    if (local_74 == 0) break;
    if (local_74 == 1) {
      local_7c = 0;
      while( true ) {
        SVectorBase<double>::value(pSVar2,local_7c);
        bVar3 = isZero<double,double>
                          ((double)in_stack_ffffffffffffff40,
                           (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        if (!bVar3) break;
        local_7c = local_7c + 1;
      }
      lVar13 = *(long *)(in_RDI + 0x10);
      pcVar6 = SVectorBase<double>::index(pSVar2,(char *)(ulong)local_7c,__c);
      if (-1 < *(int *)(lVar13 + (long)(int)pcVar6 * 4)) {
        *in_RDI = 2;
        return;
      }
      pdVar7 = SVectorBase<double>::value(pSVar2,local_7c);
      RVar12 = *pdVar7;
      RVar11 = spxAbs<double>(RVar12);
      iVar5 = extraout_EDX;
      if (*(double *)(in_RDI + 4) <= RVar11 && RVar11 != *(double *)(in_RDI + 4)) {
        RVar12 = spxAbs<double>(RVar12);
        *(Real *)(in_RDI + 4) = RVar12;
        iVar5 = extraout_EDX_00;
      }
      p_row = local_70;
      SVectorBase<double>::index(pSVar2,(char *)(ulong)local_7c,iVar5);
      setPivot((CLUFactor<double> *)CONCAT44(in_stack_ffffffffffffff64,iVar4),
               (int)((ulong)lVar13 >> 0x20),(int)lVar13,p_row,
               (double)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      *(int *)(lVar1 + (long)(int)in_RDI[0x82] * 4) = local_70;
      in_RDI[0x82] = in_RDI[0x82] + 1;
      *(undefined4 *)(*(long *)(in_RDI + 0x6c) + (long)local_70 * 4) = 0;
      *(undefined4 *)(*(long *)(in_RDI + 0x6a) + (long)local_70 * 4) = 0;
      *(undefined4 *)(*(long *)(in_RDI + 0x80) + (long)local_70 * 4) = 0;
    }
    else {
      local_74 = 0;
      local_88 = 0;
      while (in_stack_ffffffffffffff4c = local_88, iVar4 = SVectorBase<double>::size(pSVar2),
            (int)in_stack_ffffffffffffff4c < iVar4) {
        pdVar7 = SVectorBase<double>::value(pSVar2,local_88);
        a = (CLUFactor<double> *)*pdVar7;
        bVar3 = isNotZero<double,double>
                          ((double)in_stack_ffffffffffffff40,
                           (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        if (bVar3) {
          pcVar6 = SVectorBase<double>::index(pSVar2,(char *)(ulong)local_88,__c_00);
          iVar4 = (int)pcVar6;
          *(int *)(*(long *)(in_RDI + 0x60) + (long)local_24 * 4) = iVar4;
          local_24 = local_24 + 1;
          iVar5 = *(int *)(*(long *)(in_RDI + 0x50) + (long)iVar4 * 4) +
                  *(int *)(*(long *)(in_RDI + 0x52) + (long)iVar4 * 4);
          *(int *)(*(long *)(in_RDI + 0x4e) + (long)iVar5 * 4) = local_70;
          in_stack_ffffffffffffff40 = a;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x48),(long)iVar5
                             );
          *pvVar8 = (value_type)in_stack_ffffffffffffff40;
          *(int *)(*(long *)(in_RDI + 0x52) + (long)iVar4 * 4) =
               *(int *)(*(long *)(in_RDI + 0x52) + (long)iVar4 * 4) + 1;
          RVar12 = spxAbs<double>((Real)a);
          if (*(double *)(in_RDI + 4) <= RVar12 && RVar12 != *(double *)(in_RDI + 4)) {
            RVar12 = spxAbs<double>((Real)a);
            *(Real *)(in_RDI + 4) = RVar12;
          }
          local_74 = local_74 + 1;
        }
        local_88 = local_88 + 1;
      }
      *(int *)(*(long *)(in_RDI + 0x6c) + (long)local_70 * 4) = local_74;
      *(int *)(*(long *)(in_RDI + 0x6a) + (long)local_70 * 4) = local_74;
      *(int *)(*(long *)(in_RDI + 0x80) + (long)local_70 * 4) = local_74;
    }
    local_70 = local_70 + 1;
  }
  *in_RDI = 2;
  return;
}

Assistant:

void CLUFactor<R>::initFactorMatrix(const SVectorBase<R>** vec, const R eps)
{

   R x;
   int m;
   int tot;
   Dring* rring, *lastrring;
   Dring* cring, *lastcring;
   const SVectorBase<R>* psv;
   int* sing = temp.s_mark;

   /*  Initialize:
    *  - column file thereby remembering column singletons in |sing|.
    *  - nonzeros counts per row
    *  - total number of nonzeros
    */

   for(int i = 0; i < thedim; i++)
      u.row.max[i] = u.row.len[i] = 0;

   tot = 0;

   for(int i = 0; i < thedim; i++)
   {
      int k;

      psv = vec[i];
      k = psv->size();

      if(k > 1)
      {
         tot += k;

         for(int j = 0; j < k; ++j)
            u.row.max[psv->index(j)]++;
      }
      else if(k == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }
   }

   /*  Resize nonzero memory if necessary
    */
   minRowMem(int(rowMemMult * tot));

   minColMem(int(colMemMult * tot));

   minLMem(int(lMemMult * tot));


   /*  Initialize:
    *  - row ring lists
    *  - row vectors in file
    *  - column ring lists
    */
   u.row.start[0] = 0;

   rring = u.row.elem;

   lastrring = &(u.row.list);

   lastrring->idx = thedim;

   lastrring->next = rring;

   cring = u.col.elem;

   lastcring = &(u.col.list);

   lastcring->idx = thedim;

   lastcring->next = cring;

   m = 0;

   for(int i = 0; i < thedim; i++)
   {
      u.row.start[i] = m;
      m += u.row.max[i];

      rring->idx = i;
      rring->prev = lastrring;
      lastrring->next = rring;
      lastrring = rring;
      ++rring;

      cring->idx = i;
      cring->prev = lastcring;
      lastcring->next = cring;
      lastcring = cring;
      ++cring;
   }

   u.row.start[thedim]       = 0;

   u.row.max[thedim]       = 0;
   u.row.used = m;

   lastrring->next = &(u.row.list);
   lastrring->next->prev = lastrring;

   lastcring->next = &(u.col.list);
   lastcring->next->prev = lastcring;

   /*  Copy matrix to row and column file
    *  excluding and marking column singletons!
    */
   m = 0;
   temp.stage = 0;

   initMaxabs = 0;

   for(int i = 0; i < thedim; i++)
   {
      int nnonzeros;

      psv = vec[i];
      u.col.start[i] = m;

      /* check whether number of nonzeros above tolerance is 0, 1 or >= 2 */
      nnonzeros = 0;

      for(int j = 0; j < psv->size() && nnonzeros <= 1; j++)
      {
         if(isNotZero(psv->value(j), eps))
            nnonzeros++;
      }

      /* basis is singular due to empty column */
      if(nnonzeros == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }

      /* exclude column singletons */
      else if(nnonzeros == 1)
      {
         int j = 0;

         /* find nonzero */

         for(j = 0; isZero(psv->value(j), eps); j++)
            ;

         assert(j < psv->size());

         /* basis is singular due to two linearly dependent column singletons */
         if(row.perm[psv->index(j)] >= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         /* update maximum absolute nonzero value */
         x = psv->value(j);

         if(spxAbs(x) > initMaxabs)
            initMaxabs = spxAbs(x);

         /* permute to front and mark as singleton */
         setPivot(temp.stage, i, psv->index(j), x);

         sing[temp.stage] = i;

         temp.stage++;

         /* set column length to zero */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = 0;
      }

      /* add to active matrix if not a column singleton */
      else
      {
         int end;
         int k;

         /* go through all nonzeros in column */
         assert(nnonzeros >= 2);
         nnonzeros = 0;

         for(int j = 0; j < psv->size(); j++)
         {
            x = psv->value(j);

            if(isNotZero(x, eps))
            {
               /* add to column array */
               k = psv->index(j);
               u.col.idx[m] = k;
               m++;

               /* add to row array */
               end = u.row.start[k] + u.row.len[k];
               u.row.idx[end] = i;
               u.row.val[end] = x;
               u.row.len[k]++;

               /* update maximum absolute nonzero value */

               if(spxAbs(x) > initMaxabs)
                  initMaxabs = spxAbs(x);

               nnonzeros++;
            }
         }

         assert(nnonzeros >= 2);

         /* set column length */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = nnonzeros;
      }
   }

   u.col.used = m;
}